

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O1

void __thiscall DIS::DetonationPdu::~DetonationPdu(DetonationPdu *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  
  (this->super_WarfareFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__DetonationPdu_001b40c0;
  pVVar1 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar3 = pVVar1;
  if (pVVar2 != pVVar1) {
    do {
      (**pVVar3->_vptr_VariableParameter)(pVVar3);
      pVVar3 = pVVar3 + 1;
    } while (pVVar3 != pVVar2);
    (this->_variableParameters).
    super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::~vector
            (&this->_variableParameters);
  Vector3Float::~Vector3Float(&this->_locationOfEntityCoordinates);
  MunitionDescriptor::~MunitionDescriptor(&this->_descriptor);
  Vector3Double::~Vector3Double(&this->_locationInWorldCoordinates);
  Vector3Float::~Vector3Float(&this->_velocity);
  EventIdentifier::~EventIdentifier(&this->_eventID);
  EntityID::~EntityID(&this->_explodingEntityID);
  WarfareFamilyPdu::~WarfareFamilyPdu(&this->super_WarfareFamilyPdu);
  return;
}

Assistant:

DetonationPdu::~DetonationPdu()
{
    _variableParameters.clear();
}